

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O3

int get_num_images(char *imgdirpath)

{
  DIR *__dirp;
  dirent *pdVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  __dirp = opendir(imgdirpath);
  if (__dirp == (DIR *)0x0) {
    iVar4 = 0;
    fprintf(_stderr,"Could not open Folder %s\n",imgdirpath);
  }
  else {
    pdVar1 = readdir(__dirp);
    iVar4 = 0;
    while (pdVar1 != (dirent *)0x0) {
      if ((byte)pdVar1->d_name[0] == 0x2e) {
        if (pdVar1->d_name[1] != '\0') {
          uVar2 = (byte)pdVar1->d_name[1] - 0x2e;
          if (uVar2 == 0) {
            uVar2 = (uint)(byte)pdVar1->d_name[2];
          }
          iVar3 = -uVar2;
          goto LAB_00106116;
        }
      }
      else {
        iVar3 = 0x2e - (uint)(byte)pdVar1->d_name[0];
LAB_00106116:
        if (iVar3 != 0) {
          iVar4 = iVar4 + 1;
        }
      }
      pdVar1 = readdir(__dirp);
    }
    closedir(__dirp);
  }
  return iVar4;
}

Assistant:

int get_num_images(char *imgdirpath)
{
    DIR *dir;
    struct dirent* content;
    int num_images = 0;

    /*Reading the input images from given input directory*/

    dir = opendir(imgdirpath);
    if (!dir) {
        fprintf(stderr, "Could not open Folder %s\n", imgdirpath);
        return 0;
    }

    while ((content = readdir(dir)) != NULL) {
        if (strcmp(".", content->d_name) == 0 || strcmp("..", content->d_name) == 0) {
            continue;
        }
        num_images++;
    }
    closedir(dir);
    return num_images;
}